

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O3

void __thiscall picobench::runner::runner(runner *this,bool local)

{
  initializer_list<int> __l;
  allocator_type local_39;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> local_38;
  
  this->_error = no_error;
  (this->super_registry)._suites.
  super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_registry)._suites.
  super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_registry)._current_suite_name = (char *)0x0;
  (this->super_registry)._suites.
  super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->_should_run = true;
  this->_compare_results_across_samples = false;
  this->_compare_results_across_benchmarks = false;
  this->_output_format = text;
  this->_output_file = (char *)0x0;
  this->_stdout = (ostream *)&std::cout;
  this->_stderr = (ostream *)&std::cerr;
  this->_stdwarn = (ostream *)&std::cout;
  local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000008;
  local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x100000000200;
  local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_38.
                         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x2000);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&this->_default_state_iterations,__l,&local_39);
  this->_default_samples = 2;
  (this->_cmd_prefix).len = 0;
  this->_has_opts = false;
  (this->_opts).
  super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_opts).
  super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_opts).
  super__Vector_base<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!local) {
    g_registry();
    local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (this->super_registry)._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->super_registry)._suites.
    super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         g_registry::r._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->super_registry)._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_38.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->super_registry)._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->super_registry)._suites.
    super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_start =
         g_registry::r._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->super_registry)._suites.
    super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_registry::r._suites.
         super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
         super__Vector_impl_data._M_finish;
    g_registry::r._suites.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    g_registry::r._suites.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    g_registry::r._suites.super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::~vector(&local_38);
  }
  return;
}

Assistant:

runner(bool local = false)
        : _default_state_iterations(PICOBENCH_DEFAULT_ITERATIONS)
        , _default_samples(PICOBENCH_DEFAULT_SAMPLES)
    {
        if (!local)
        {
            _suites = std::move(g_registry()._suites);
        }
    }